

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

_Bool cf_ssl_scache_match_auth(Curl_ssl_scache_peer *peer,ssl_primary_config *conn_config)

{
  _Bool _Var1;
  int iVar2;
  ssl_primary_config *conn_config_local;
  Curl_ssl_scache_peer *peer_local;
  
  if (conn_config == (ssl_primary_config *)0x0) {
    if (peer->clientcert == (char *)0x0) {
      if ((peer->srp_username == (char *)0x0) && (peer->srp_password == (char *)0x0)) {
        peer_local._7_1_ = true;
      }
      else {
        peer_local._7_1_ = false;
      }
    }
    else {
      peer_local._7_1_ = false;
    }
  }
  else {
    _Var1 = Curl_safecmp(peer->clientcert,conn_config->clientcert);
    if (_Var1) {
      iVar2 = Curl_timestrcmp(peer->srp_username,conn_config->username);
      if ((iVar2 == 0) &&
         (iVar2 = Curl_timestrcmp(peer->srp_password,conn_config->password), iVar2 == 0)) {
        return true;
      }
      peer_local._7_1_ = false;
    }
    else {
      peer_local._7_1_ = false;
    }
  }
  return peer_local._7_1_;
}

Assistant:

static bool cf_ssl_scache_match_auth(struct Curl_ssl_scache_peer *peer,
                                     struct ssl_primary_config *conn_config)
{
  if(!conn_config) {
    if(peer->clientcert)
      return FALSE;
#ifdef USE_TLS_SRP
    if(peer->srp_username || peer->srp_password)
      return FALSE;
#endif
    return TRUE;
  }
  else if(!Curl_safecmp(peer->clientcert, conn_config->clientcert))
    return FALSE;
#ifdef USE_TLS_SRP
   if(Curl_timestrcmp(peer->srp_username, conn_config->username) ||
      Curl_timestrcmp(peer->srp_password, conn_config->password))
     return FALSE;
#endif
  return TRUE;
}